

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_tointegerns(TValue *obj,lua_Integer *p,F2Imod mode)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (obj->tt_ == 0x13) {
    *p = (lua_Integer)obj->value_;
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (obj->tt_ == 3) {
      dVar1 = (obj->value_).n;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar6 = vroundsd_avx(auVar7,auVar7,9);
      dVar5 = auVar6._0_8_;
      if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
        if (mode == F2Ieq) {
          return 0;
        }
        if (mode == F2Iceil) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = dVar5 + 1.0;
        }
      }
      uVar2 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar6,2);
      uVar4 = vcmppd_avx512vl(auVar6,ZEXT816(0x43e0000000000000),1);
      uVar4 = ((byte)uVar2 & 3) & uVar4;
      if ((uVar4 & 1) != 0) {
        *p = (long)auVar6._0_8_;
      }
      return (uint)uVar4 & 1;
    }
  }
  return iVar3;
}

Assistant:

int luaV_tointegerns (const TValue *obj, lua_Integer *p, F2Imod mode) {
  if (ttisfloat(obj))
    return luaV_flttointeger(fltvalue(obj), p, mode);
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else
    return 0;
}